

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * sjistosjis(char *source)

{
  size_t sVar1;
  char *__dest;
  char *in_RDI;
  char *temp;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    __dest = (char *)malloc(sVar1 + 1);
    if (__dest == (char *)0x0) {
      g_lastError = OPENJTALKERROR_MALLOC_ERROR;
      local_8 = (char *)0x0;
    }
    else {
      local_8 = strcpy(__dest,in_RDI);
    }
  }
  return local_8;
}

Assistant:

char *sjistosjis(const char *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char *temp = (char *)malloc(strlen(source) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpy(temp, source);
}